

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O0

bool __thiscall Ptex::v2_2::PtexCachedReader::tryPrune(PtexCachedReader *this,size_t *memUsedChange)

{
  bool bVar1;
  size_t sVar2;
  size_t *in_RSI;
  PtexCachedReader *in_RDI;
  PtexReader *unaff_retaddr;
  
  bVar1 = trylock(in_RDI);
  if (bVar1) {
    PtexReader::prune(unaff_retaddr);
    sVar2 = getMemUsedChange(in_RDI);
    *in_RSI = sVar2;
    unlock(in_RDI);
  }
  return bVar1;
}

Assistant:

bool tryPrune(size_t& memUsedChange) {
        if (trylock()) {
            prune();
            memUsedChange = getMemUsedChange();
            unlock();
            return true;
        }
        return false;
    }